

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_exchange.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int ranks_00;
  int ranks_01;
  int ranks_02;
  int rank;
  int ranks;
  int argc_local;
  char **argv_local;
  
  argc_local = argc;
  argv_local = argv;
  MPI_Init(&argc_local,&argv_local);
  MPI_Comm_rank(&ompi_mpi_comm_world,&rank);
  MPI_Comm_size(&ompi_mpi_comm_world,&ranks);
  if (ranks == 3) {
    iVar1 = exchange(0,rank,ranks_00);
    if (iVar1 == 0) {
      iVar1 = exchange(1,rank,ranks_01);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = exchange(-1,rank,ranks_02);
      if (iVar1 != 0) {
        return 1;
      }
      MPI_Finalize();
      return 0;
    }
  }
  else {
    printf("test_kvtree_exchange, tests require 3 processes; actual # is %d\n");
  }
  return 1;
}

Assistant:

int main(int argc, char** argv){
  int rank,ranks;
  MPI_Init(&argc, &argv);
  MPI_Comm_rank(MPI_COMM_WORLD, &rank);
  MPI_Comm_size(MPI_COMM_WORLD, &ranks);
  if( ranks != 3){
    printf("test_kvtree_exchange, tests require 3 processes; actual # is %d\n", ranks);
    return TEST_FAIL;
  }
  //call sraight kvtree_exchange
  if(exchange(0, rank, ranks) == TEST_FAIL) return TEST_FAIL;
  //call kvtree_exchange_direction RIGHT
  if(exchange(1, rank, ranks) == TEST_FAIL) return TEST_FAIL;
  //call kvtree_exchange_direction LEFT
  if(exchange(-1, rank, ranks) == TEST_FAIL) return TEST_FAIL;

  MPI_Finalize();
  return TEST_PASS;
}